

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void statement(object *proc,int retSize)

{
  int b;
  bool bVar1;
  item *x;
  item *x_00;
  object *y;
  typeDesc *ptVar2;
  object *fp;
  procFixStruct *ppVar3;
  procFixStruct *ppVar4;
  int iVar5;
  object **ppoVar6;
  char *msg;
  
  x = (item *)calloc(1,0x30);
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol < 0x25d) {
    if (currentSymbol == 0x1f5) {
      y = find();
      getSymbol();
      makeItem(x,y);
      selector(x);
      if (currentSymbol != 0x65) {
        if (x->mode == 0x2c4) {
          param(x_00);
          if (y->val < 7) {
            IOCall(x,x_00);
          }
          goto LAB_00107f0d;
        }
        if (x->mode != 0x2c0) {
          return;
        }
        ppoVar6 = &y->dsc;
        if (y->val < 0) {
          ppoVar6 = &(*ppoVar6)->next;
        }
        fp = *ppoVar6;
        if (currentSymbol == 0x12d) {
          getSymbol();
          if (currentSymbol != 0x12e) {
            fp = parameter(fp);
            do {
              bVar1 = true;
              if (currentSymbol == 0xcc) {
LAB_00107f4b:
                getSymbol();
              }
              else if (currentSymbol == 0x12e) {
                bVar1 = false;
                goto LAB_00107f4b;
              }
              if (!bVar1) goto LAB_00107f65;
              fp = parameter(fp);
            } while( true );
          }
          getSymbol();
        }
LAB_00107f65:
        semicolon();
        iVar5 = pc;
        if (fp->cl == 0x2c1) {
          if (fp->val < 1) goto LAB_00107f7c;
        }
        else if (fp->cl != 0x2c5) {
LAB_00107f7c:
          ppVar4 = procFixList;
          if (y->val < 0) {
            do {
              ppVar3 = ppVar4;
              ppVar4 = ppVar3->next;
            } while (ppVar4 != (procFixStruct *)0x0);
            ppVar4 = (procFixStruct *)calloc(1,0x18);
            ppVar4->pos = iVar5;
            ppVar4->proc = y;
            ppVar3->next = ppVar4;
            ppVar4->next = (procFixStruct *)0x0;
            iVar5 = 0;
          }
          else {
            iVar5 = x->a - pc;
          }
          put(0x2e,0,0,iVar5);
          return;
        }
        msg = "too few parameters";
        goto LAB_00108000;
      }
      getSymbol();
      if (currentSymbol != 0x26a) {
        if (currentSymbol == 0x1f8) {
          simpleExpression(x_00);
        }
        else {
          expression(x_00);
        }
        store(x,x_00);
        goto LAB_00107f0d;
      }
      ptVar2 = getType(x->typeIndex);
      if (ptVar2->form == 0x324) {
        iVar5 = 0x34;
        if (x->mode != 0x2c6) {
          if (x->mode != 0x2c1) goto LAB_00107ff9;
          iVar5 = 0x24;
          if (x->lev == 0) {
            x->a = x->a + RISC_MEMSIZE;
          }
        }
        b = x->r;
        put(iVar5,0,b,x->a);
        regs[b] = 0;
        getSymbol();
LAB_00107f0d:
        semicolon();
        return;
      }
LAB_00107ff9:
      msg = "incompatible NULL pointer assignment";
      goto LAB_00108000;
    }
    if (currentSymbol == 0x259) {
      getSymbol();
      iterationStatement(proc,retSize);
      return;
    }
    if (currentSymbol == 0x25a) {
      getSymbol();
      conditionalBranchStatement(proc,retSize);
      return;
    }
  }
  else {
    if (currentSymbol == 0x25d) {
      getSymbol();
      returnStatement(proc,retSize);
      return;
    }
    if (currentSymbol == 0x26b) {
      getSymbol();
      allocStatement();
      return;
    }
    if (currentSymbol == 0x26e) {
      getSymbol();
      exitStatement();
      return;
    }
  }
  msg = "unknown statement";
LAB_00108000:
  mark(msg);
  exit(-1);
}

Assistant:

procedure 
void statement(struct object *proc, int retSize)  {
	variable struct item *x; variable struct item *y;
	variable struct object *obj; variable struct object *procObj; variable struct object *par;
	variable struct typeDesc *type;
	variable bool cond; variable int jumpTo;
	x = NULL; y = NULL; obj = NULL; par = NULL; type = NULL; procObj = NULL; jumpTo = 0;
	cond = true;
	allocMem(x); allocMem(y);	
	if (currentSymbol == SYMBOL_IDENTIFIER) {
		obj = find();
		getSymbol();
		makeItem(x,obj);
		selector(x);
		if (currentSymbol == SYMBOL_ASSIGN) {
			getSymbol();
			if (currentSymbol == SYMBOL_CHARACTERLITERAL) {
				simpleExpression(y);
				store(x,y);
			} elsif (currentSymbol == SYMBOL_NULL) {
				type = getType(x->typeIndex);
				if (type->form == FORM_REF) {
					if (x->mode == CLASS_VAR) {
						if (x->lev == 0) {
							x->a = RISC_MEMSIZE + x->a;
						}
						put(RISC_STW,0,x->r,x->a);
					} elsif (x->mode == CLASS_IND) { 
						put(RISC_HSTW,0,x->r,x->a);
					} else {
						mark("incompatible NULL pointer assignment");
						exit(-1);
					}
					regs[x->r] = 0; /* free x->r */
				} else {
					mark("incompatible NULL pointer assignment");
					exit(-1);
				}
				getSymbol();
			} else 	{
				expression(y);
				store(x,y);
			}
			semicolon();
		} elsif (x->mode == CLASS_PROC) { 
			procObj = obj;
			if (procObj->val < 0) { /* prototype => dsc still points to head for further use */
				par = obj->dsc->next;
			} else {
				par = obj->dsc;
			}
			if (currentSymbol == SYMBOL_LPARAN) { 
				getSymbol(); 
				if (currentSymbol == SYMBOL_RPARAN) {
					getSymbol();
				} else {
					par = parameter(par);
					while (cond == true) {
						if (currentSymbol == SYMBOL_COMMA) {
							getSymbol();
						} elsif (currentSymbol == SYMBOL_RPARAN) {
							getSymbol();
							cond = false;
						}
						if (cond == true) {
							par = parameter(par);
						}
					}
				}
			}
			semicolon();
			if (isParameter(par) != true) {
				if (procObj->val < 0) { /* only prototype exists till now */
					addProcToFixList(pc,procObj);
					jumpTo = 0;
				} else {
					jumpTo = x->a - pc;
				}
				call(x,jumpTo);
			} else {
				mark("too few parameters");
				exit(-1);
			}
		} elsif (x->mode == CLASS_SPROC) { 
			param(y);
			if (obj->val <= 6) {
				IOCall(x,y);
			}
			semicolon();
		}
	}